

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O1

void __thiscall BarrierTest_Wait_Test::TestBody(BarrierTest_Wait_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  TrueWithString gtest_msg;
  arrival_token token;
  barrier<yamc::detail::default_barrier_completion> barrier;
  uint local_b8 [9];
  uint local_94;
  barrier<yamc::detail::default_barrier_completion> local_90;
  
  local_90.init_count_ = 1;
  local_90.counter_ = 1;
  local_90.phase_ = 0;
  std::condition_variable::condition_variable(&local_90.cv_);
  local_90.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_90.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_90.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_90.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_90.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_b8[0] = (uint)yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&local_90,1)
    ;
    yamc::barrier<yamc::detail::default_barrier_completion>::wait(&local_90,local_b8);
  }
  local_94 = (uint)yamc::barrier<yamc::detail::default_barrier_completion>::arrive(&local_90,1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::wait(&local_90,&local_94);
  }
  std::condition_variable::~condition_variable(&local_90.cv_);
  return;
}

Assistant:

TEST(BarrierTest, Wait)
{
  yamc::barrier<> barrier{1};
  EXPECT_NO_THROW(barrier.wait(barrier.arrive()));
  auto token = barrier.arrive();
  EXPECT_NO_THROW(barrier.wait(std::move(token)));
}